

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ltm.c
# Opt level: O1

void luaT_trybinTM(lua_State *L,TValue *p1,TValue *p2,StkId res,TMS event)

{
  int iVar1;
  char *msg;
  
  iVar1 = luaT_callbinTM(L,p1,p2,res,event);
  if (iVar1 != 0) {
    return;
  }
  if ((event - TM_BAND < 5) || (event == TM_BNOT)) {
    if (((p1->tt_ & 0xf) == 3) && ((p2->tt_ & 0xf) == 3)) {
      luaG_tointerror(L,p1,p2);
    }
    msg = "perform bitwise operation on";
  }
  else {
    if (event == TM_CONCAT) {
      luaG_concaterror(L,p1,p2);
    }
    msg = "perform arithmetic on";
  }
  luaG_opinterror(L,p1,p2,msg);
}

Assistant:

void luaT_trybinTM (lua_State *L, const TValue *p1, const TValue *p2,
                    StkId res, TMS event) {
  if (!luaT_callbinTM(L, p1, p2, res, event)) {
    switch (event) {
      case TM_CONCAT:
        luaG_concaterror(L, p1, p2);
      /* call never returns, but to avoid warnings: *//* FALLTHROUGH */
      case TM_BAND: case TM_BOR: case TM_BXOR:
      case TM_SHL: case TM_SHR: case TM_BNOT: {
        if (ttisnumber(p1) && ttisnumber(p2))
          luaG_tointerror(L, p1, p2);
        else
          luaG_opinterror(L, p1, p2, "perform bitwise operation on");
      }
      /* calls never return, but to avoid warnings: *//* FALLTHROUGH */
      default:
        luaG_opinterror(L, p1, p2, "perform arithmetic on");
    }
  }
}